

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O3

int __thiscall cmCPackIFWPackage::ConfigureFromPrefix(cmCPackIFWPackage *this,string *prefix)

{
  pointer pcVar1;
  cmCPackIFWGenerator *pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  cmValue cVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  char *pcVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  pointer dependence;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string option;
  cmList deps;
  cmList depsOn;
  DependenceStruct local_e0;
  string local_98;
  _Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
  *local_78;
  cmCPackIFWPackage *local_70;
  cmList local_68;
  cmList local_50;
  mapped_type *local_38;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  paVar12 = &local_e0.Name.field_2;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&(this->DisplayName)._M_t);
  }
  else {
    cVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_98);
    if (cVar6.Value != (string *)0x0) {
      cmCPackIFWCommon::ExpandListArgument(cVar6.Value,&this->DisplayName);
    }
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&(this->Description)._M_t);
  }
  else {
    cVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_98);
    if (cVar6.Value != (string *)0x0) {
      cmCPackIFWCommon::ExpandListArgument(cVar6.Value,&this->Description);
    }
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    (this->ReleaseDate)._M_string_length = 0;
    *(this->ReleaseDate)._M_dataplus._M_p = '\0';
  }
  else {
    cVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_98);
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->ReleaseDate);
    }
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    (this->SortingPriority)._M_string_length = 0;
    *(this->SortingPriority)._M_dataplus._M_p = '\0';
  }
  else {
    cVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_98);
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->SortingPriority);
    }
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    (this->UpdateText)._M_string_length = 0;
    *(this->UpdateText)._M_dataplus._M_p = '\0';
  }
  else {
    cVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_98);
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->UpdateText);
    }
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->Translations,
                      (this->Translations).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    cVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_98);
    if (cVar6.Value != (string *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&this->Translations,
                        (this->Translations).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      cmList::Insert(&this->Translations,
                     (this->Translations).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,cVar6.Value,Yes,No);
    }
  }
  local_68.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_68.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_68.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  cVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_98);
  if (cVar6.Value != (string *)0x0) {
    cmList::assign(&local_68,cVar6,Yes,No);
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  cVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_98);
  if (cVar6.Value != (string *)0x0) {
    cmList::Insert(&local_68.Values,
                   (const_iterator)
                   local_68.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,cVar6.Value,Yes,No);
  }
  pbVar3 = local_68.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = this;
  if (local_68.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_78 = (_Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
                *)&this->AlienDependencies;
    dependence = local_68.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    do {
      DependenceStruct::DependenceStruct(&local_e0,dependence);
      pcVar2 = (this->super_cmCPackIFWCommon).Generator;
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
              ::find(&(pcVar2->Packages)._M_t,&local_e0.Name);
      if ((_Rb_tree_header *)cVar7._M_node != &(pcVar2->Packages)._M_t._M_impl.super__Rb_tree_header
         ) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
        ::operator[](&((this->super_cmCPackIFWCommon).Generator)->Packages,&local_e0.Name);
        std::__cxx11::string::_M_assign((string *)&local_e0);
      }
      pcVar2 = (this->super_cmCPackIFWCommon).Generator;
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
              ::find(&(pcVar2->DependentPackages)._M_t,&local_e0.Name);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
               ::operator[](&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,
                            &local_e0.Name);
      if ((_Rb_tree_header *)cVar8._M_node ==
          &(pcVar2->DependentPackages)._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::_M_assign((string *)pmVar9);
        (pmVar9->Compare).Type = local_e0.Compare.Type;
        std::__cxx11::string::_M_assign((string *)&(pmVar9->Compare).Value);
      }
      local_50.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = &pmVar9->Name;
      std::
      _Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
      ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct*>
                (local_78,(DependenceStruct **)&local_50);
      this = local_70;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.Compare.Value._M_dataplus._M_p != &local_e0.Compare.Value.field_2) {
        operator_delete(local_e0.Compare.Value._M_dataplus._M_p,
                        local_e0.Compare.Value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.Name._M_dataplus._M_p != &local_e0.Name.field_2) {
        operator_delete(local_e0.Name._M_dataplus._M_p,
                        local_e0.Name.field_2._M_allocated_capacity + 1);
      }
      dependence = dependence + 1;
    } while (dependence != pbVar3);
  }
  paVar12 = &local_e0.Name.field_2;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    std::
    _Rb_tree<cmCPackIFWPackage::DependenceStruct_*,_cmCPackIFWPackage::DependenceStruct_*,_std::_Identity<cmCPackIFWPackage::DependenceStruct_*>,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
    ::clear(&(this->AlienAutoDependOn)._M_t);
  }
  else {
    cVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_98);
    if (cVar6.Value != (string *)0x0) {
      pcVar1 = ((cVar6.Value)->_M_dataplus)._M_p;
      local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar1,pcVar1 + (cVar6.Value)->_M_string_length);
      init._M_len = 1;
      init._M_array = &local_e0.Name;
      cmList::cmList(&local_50,init);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.Name._M_dataplus._M_p != paVar12) {
        operator_delete(local_e0.Name._M_dataplus._M_p,
                        local_e0.Name.field_2._M_allocated_capacity + 1);
      }
      if (local_50.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_50.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_78 = (_Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
                    *)&this->AlienAutoDependOn;
        pmVar9 = (mapped_type *)
                 local_50.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          DependenceStruct::DependenceStruct(&local_e0,&pmVar9->Name);
          pcVar2 = (this->super_cmCPackIFWCommon).Generator;
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                  ::find(&(pcVar2->Packages)._M_t,&local_e0.Name);
          if ((_Rb_tree_header *)cVar7._M_node !=
              &(pcVar2->Packages)._M_t._M_impl.super__Rb_tree_header) {
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
            ::operator[](&((this->super_cmCPackIFWCommon).Generator)->Packages,&local_e0.Name);
            std::__cxx11::string::_M_assign((string *)&local_e0);
          }
          pcVar2 = (this->super_cmCPackIFWCommon).Generator;
          cVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                  ::find(&(pcVar2->DependentPackages)._M_t,&local_e0.Name);
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                    ::operator[](&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,
                                 &local_e0.Name);
          if ((_Rb_tree_header *)cVar8._M_node ==
              &(pcVar2->DependentPackages)._M_t._M_impl.super__Rb_tree_header) {
            std::__cxx11::string::_M_assign((string *)pmVar10);
            (pmVar10->Compare).Type = local_e0.Compare.Type;
            std::__cxx11::string::_M_assign((string *)&(pmVar10->Compare).Value);
          }
          local_38 = pmVar10;
          std::
          _Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
          ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct*>(local_78,&local_38);
          this = local_70;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.Compare.Value._M_dataplus._M_p != &local_e0.Compare.Value.field_2) {
            operator_delete(local_e0.Compare.Value._M_dataplus._M_p,
                            local_e0.Compare.Value.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.Name._M_dataplus._M_p != &local_e0.Name.field_2) {
            operator_delete(local_e0.Name._M_dataplus._M_p,
                            local_e0.Name.field_2._M_allocated_capacity + 1);
          }
          pmVar9 = (mapped_type *)&pmVar9->Compare;
        } while (pmVar9 != (mapped_type *)
                           local_50.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_50.Values);
    }
  }
  paVar12 = &local_e0.Name.field_2;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    (this->Virtual)._M_string_length = 0;
    *(this->Virtual)._M_dataplus._M_p = '\0';
  }
  else {
    bVar4 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_98);
    if (bVar4) {
      std::__cxx11::string::_M_replace
                ((ulong)&this->Virtual,0,(char *)(this->Virtual)._M_string_length,0x807e77);
    }
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    (this->Default)._M_string_length = 0;
    *(this->Default)._M_dataplus._M_p = '\0';
  }
  else {
    cVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_98);
    if (cVar6.Value != (string *)0x0) {
      cmsys::SystemTools::LowerCase(&local_e0.Name,cVar6.Value);
      pcVar11 = "true";
      iVar5 = std::__cxx11::string::compare((char *)&local_e0);
      if (iVar5 == 0) {
LAB_001d547d:
        std::__cxx11::string::_M_replace
                  ((ulong)&this->Default,0,(char *)(this->Default)._M_string_length,(ulong)pcVar11);
      }
      else {
        pcVar11 = "false";
        iVar5 = std::__cxx11::string::compare((char *)&local_e0);
        if (iVar5 == 0) goto LAB_001d547d;
        pcVar11 = "script";
        iVar5 = std::__cxx11::string::compare((char *)&local_e0);
        if (iVar5 == 0) goto LAB_001d547d;
        std::__cxx11::string::_M_assign((string *)&this->Default);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.Name._M_dataplus._M_p != paVar12) {
        operator_delete(local_e0.Name._M_dataplus._M_p,
                        local_e0.Name.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    (this->ForcedInstallation)._M_string_length = 0;
    *(this->ForcedInstallation)._M_dataplus._M_p = '\0';
  }
  else {
    bVar4 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_98);
    if (bVar4) {
      pcVar11 = "true";
    }
    else {
      bVar4 = cmCPackIFWCommon::IsSetToOff(&this->super_cmCPackIFWCommon,&local_98);
      if (!bVar4) goto LAB_001d5573;
      pcVar11 = "false";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->ForcedInstallation,0,
               (char *)(this->ForcedInstallation)._M_string_length,(ulong)pcVar11);
  }
LAB_001d5573:
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->Replaces,
                      (this->Replaces).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    cVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_98);
    if (cVar6.Value != (string *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&this->Replaces,
                        (this->Replaces).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      cmList::Insert(&this->Replaces,
                     (this->Replaces).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,cVar6.Value,Yes,No);
    }
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    (this->RequiresAdminRights)._M_string_length = 0;
    *(this->RequiresAdminRights)._M_dataplus._M_p = '\0';
  }
  else {
    bVar4 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_98);
    if (bVar4) {
      pcVar11 = "true";
    }
    else {
      bVar4 = cmCPackIFWCommon::IsSetToOff(&this->super_cmCPackIFWCommon,&local_98);
      if (!bVar4) goto LAB_001d56ff;
      pcVar11 = "false";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->RequiresAdminRights,0,
               (char *)(this->RequiresAdminRights)._M_string_length,(ulong)pcVar11);
  }
LAB_001d56ff:
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_e0.Name._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.Name._M_dataplus._M_p != paVar12) {
    operator_delete(local_e0.Name._M_dataplus._M_p,local_e0.Name.field_2._M_allocated_capacity + 1);
  }
  bVar4 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,&local_98);
  if (bVar4) {
    (this->Checkable)._M_string_length = 0;
    *(this->Checkable)._M_dataplus._M_p = '\0';
  }
  else {
    bVar4 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_98);
    if (bVar4) {
      pcVar11 = "true";
    }
    else {
      bVar4 = cmCPackIFWCommon::IsSetToOff(&this->super_cmCPackIFWCommon,&local_98);
      if (!bVar4) goto LAB_001d57d0;
      pcVar11 = "false";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->Checkable,0,(char *)(this->Checkable)._M_string_length,(ulong)pcVar11);
  }
LAB_001d57d0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68.Values);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return 1;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromPrefix(const std::string& prefix)
{
  // Temporary variable for full option name
  std::string option;

  // Display name
  option = prefix + "DISPLAY_NAME";
  if (this->IsSetToEmpty(option)) {
    this->DisplayName.clear();
  } else if (cmValue value = this->GetOption(option)) {
    cmCPackIFWPackage::ExpandListArgument(*value, this->DisplayName);
  }

  // Description
  option = prefix + "DESCRIPTION";
  if (this->IsSetToEmpty(option)) {
    this->Description.clear();
  } else if (cmValue value = this->GetOption(option)) {
    cmCPackIFWPackage::ExpandListArgument(*value, this->Description);
  }

  // Release date
  option = prefix + "RELEASE_DATE";
  if (this->IsSetToEmpty(option)) {
    this->ReleaseDate.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->ReleaseDate = *value;
  }

  // Sorting priority
  option = prefix + "SORTING_PRIORITY";
  if (this->IsSetToEmpty(option)) {
    this->SortingPriority.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->SortingPriority = *value;
  }

  // Update text
  option = prefix + "UPDATE_TEXT";
  if (this->IsSetToEmpty(option)) {
    this->UpdateText.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->UpdateText = *value;
  }

  // Translations
  option = prefix + "TRANSLATIONS";
  if (this->IsSetToEmpty(option)) {
    this->Translations.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->Translations.clear();
    cmExpandList(value, this->Translations);
  }

  // QtIFW dependencies
  cmList deps;
  option = prefix + "DEPENDS";
  if (cmValue value = this->GetOption(option)) {
    deps.assign(value);
  }
  option = prefix + "DEPENDENCIES";
  if (cmValue value = this->GetOption(option)) {
    deps.append(value);
  }
  for (auto const& d : deps) {
    DependenceStruct dep(d);
    if (this->Generator->Packages.count(dep.Name)) {
      cmCPackIFWPackage& depPkg = this->Generator->Packages[dep.Name];
      dep.Name = depPkg.Name;
    }
    bool hasDep = this->Generator->DependentPackages.count(dep.Name) > 0;
    DependenceStruct& depRef = this->Generator->DependentPackages[dep.Name];
    if (!hasDep) {
      depRef = dep;
    }
    this->AlienDependencies.insert(&depRef);
  }

  // Automatic dependency on
  option = prefix + "AUTO_DEPEND_ON";
  if (this->IsSetToEmpty(option)) {
    this->AlienAutoDependOn.clear();
  } else if (cmValue value = this->GetOption(option)) {
    cmList depsOn{ value };
    for (std::string const& d : depsOn) {
      DependenceStruct dep(d);
      if (this->Generator->Packages.count(dep.Name)) {
        cmCPackIFWPackage& depPkg = this->Generator->Packages[dep.Name];
        dep.Name = depPkg.Name;
      }
      bool hasDep = this->Generator->DependentPackages.count(dep.Name) > 0;
      DependenceStruct& depRef = this->Generator->DependentPackages[dep.Name];
      if (!hasDep) {
        depRef = dep;
      }
      this->AlienAutoDependOn.insert(&depRef);
    }
  }

  // Visibility
  option = prefix + "VIRTUAL";
  if (this->IsSetToEmpty(option)) {
    this->Virtual.clear();
  } else if (this->IsOn(option)) {
    this->Virtual = "true";
  }

  // Default selection
  option = prefix + "DEFAULT";
  if (this->IsSetToEmpty(option)) {
    this->Default.clear();
  } else if (cmValue value = this->GetOption(option)) {
    std::string lowerValue = cmsys::SystemTools::LowerCase(*value);
    if (lowerValue == "true") {
      this->Default = "true";
    } else if (lowerValue == "false") {
      this->Default = "false";
    } else if (lowerValue == "script") {
      this->Default = "script";
    } else {
      this->Default = *value;
    }
  }

  // Forsed installation
  option = prefix + "FORCED_INSTALLATION";
  if (this->IsSetToEmpty(option)) {
    this->ForcedInstallation.clear();
  } else if (this->IsOn(option)) {
    this->ForcedInstallation = "true";
  } else if (this->IsSetToOff(option)) {
    this->ForcedInstallation = "false";
  }

  // Replaces
  option = prefix + "REPLACES";
  if (this->IsSetToEmpty(option)) {
    this->Replaces.clear();
  } else if (cmValue value = this->GetOption(option)) {
    this->Replaces.clear();
    cmExpandList(value, this->Replaces);
  }

  // Requires admin rights
  option = prefix + "REQUIRES_ADMIN_RIGHTS";
  if (this->IsSetToEmpty(option)) {
    this->RequiresAdminRights.clear();
  } else if (this->IsOn(option)) {
    this->RequiresAdminRights = "true";
  } else if (this->IsSetToOff(option)) {
    this->RequiresAdminRights = "false";
  }

  // Checkable
  option = prefix + "CHECKABLE";
  if (this->IsSetToEmpty(option)) {
    this->Checkable.clear();
  } else if (this->IsOn(option)) {
    this->Checkable = "true";
  } else if (this->IsSetToOff(option)) {
    this->Checkable = "false";
  }

  return 1;
}